

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

void __thiscall ncnn::Extractor::~Extractor(Extractor *this)

{
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::_M_erase_at_end
            (&this->blob_mats,
             (this->blob_mats).super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&this->blob_mats);
  return;
}

Assistant:

Extractor::~Extractor()
{
    blob_mats.clear();

#if NCNN_VULKAN
    if (net->opt.use_vulkan_compute)
    {
        blob_mats_gpu.clear();

        if (local_blob_vkallocator)
        {
            net->vkdev->reclaim_blob_allocator(local_blob_vkallocator);
        }
        if (local_staging_vkallocator)
        {
            net->vkdev->reclaim_staging_allocator(local_staging_vkallocator);
        }
    }
#endif // NCNN_VULKAN
}